

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPMCQueue.h
# Opt level: O0

ptrdiff_t __thiscall
rigtorp::mpmc::Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_>::size
          (Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_> *this)

{
  __int_type_conflict _Var1;
  Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_> *this_local;
  memory_order __b_1;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  _Var1 = (this->head_).super___atomic_base<unsigned_long>._M_i;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  return _Var1 - (this->tail_).super___atomic_base<unsigned_long>._M_i;
}

Assistant:

ptrdiff_t size() const noexcept {
    // TODO: How can we deal with wrapped queue on 32bit?
    return static_cast<ptrdiff_t>(head_.load(std::memory_order_relaxed) -
                                  tail_.load(std::memory_order_relaxed));
  }